

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O3

void weather_update(void)

{
  ushort uVar1;
  AREA_DATA *pAVar2;
  AREA_DATA_conflict *area;
  AREA_DATA_conflict **ppAVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  size_t __n;
  char *__src;
  AREA_DATA_conflict *pAVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  char buf [4608];
  undefined8 local_1238;
  char acStack_1230 [16];
  undefined6 uStack_1220;
  undefined1 uStack_121a;
  undefined1 uStack_1219;
  undefined2 local_1218;
  undefined2 uStack_1216;
  undefined2 uStack_1214;
  undefined1 uStack_1212;
  undefined1 uStack_1211;
  undefined6 uStack_1210;
  undefined1 uStack_120a;
  undefined1 uStack_1209;
  undefined2 uStack_1208;
  undefined4 uStack_1206;
  
  if (area_first != (AREA_DATA_conflict *)0x0) {
    lVar5 = (long)time_info.season;
    pAVar8 = area_first;
    do {
      iVar4 = number_percent();
      lVar7 = 0;
      do {
        if (iVar4 <= *(short *)((long)pAVar8->climate * 0x78 + lVar5 * 0x12 + 0x48d8ca + lVar7 * 2))
        {
          pAVar8->sky = (short)lVar7;
          break;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 9);
      iVar4 = number_percent();
      lVar7 = 0;
      do {
        if (iVar4 <= *(short *)((long)pAVar8->climate * 0x78 + lVar5 * 8 + 0x48d912 + lVar7 * 2)) {
          pAVar8->temp = (short)lVar7;
          break;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      iVar4 = number_range(0,2);
      pAVar8->wind = (short)iVar4;
      area = area_first;
      pAVar8 = pAVar8->next;
    } while (pAVar8 != (AREA_DATA_conflict *)0x0);
    pAVar8 = area_first;
    if (area_first != (AREA_DATA_conflict *)0x0) {
      do {
        lVar5 = 0;
        iVar6 = 0;
        iVar4 = 0;
        do {
          pAVar2 = pAVar8->adjacent[lVar5];
          if (pAVar2 == (AREA_DATA *)0x0) {
            if (lVar5 != 0) goto LAB_002c1280;
            uVar10 = (uint)(ushort)pAVar8->sky;
            goto LAB_002c12fd;
          }
          iVar4 = iVar4 + pAVar2->sky;
          iVar6 = iVar6 + pAVar2->temp;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x19);
        lVar5 = 0x19;
LAB_002c1280:
        iVar9 = (int)lVar5 + 1;
        iVar4 = iVar4 / iVar9;
        uVar1 = pAVar8->sky;
        uVar10 = (uint)uVar1;
        uVar11 = iVar4 - (short)uVar1;
        uVar12 = -uVar11;
        if (0 < (int)uVar11) {
          uVar12 = uVar11;
        }
        if (3 < uVar12) {
          iVar4 = iVar4 + (short)uVar1;
          uVar10 = (uint)(iVar4 - (iVar4 >> 0x1f)) >> 1;
          pAVar8->sky = (short)uVar10;
        }
        iVar6 = iVar6 / iVar9;
        uVar11 = iVar6 - pAVar8->temp;
        uVar12 = -uVar11;
        if (0 < (int)uVar11) {
          uVar12 = uVar11;
        }
        if (1 < uVar12) {
          iVar6 = iVar6 + (short)uVar10;
          pAVar8->temp = (short)((uint)(iVar6 - (iVar6 >> 0x1f)) >> 1);
        }
LAB_002c12fd:
        if ((5 < (short)(ushort)uVar10) && (pAVar8->temp < 2)) {
          pAVar8->temp = 2;
        }
        if (((ushort)uVar10 < 8) && ((0xb0U >> (uVar10 & 0x1f) & 1) != 0)) {
          pAVar8->wind = pAVar8->wind + 1;
        }
        if (pAVar8->climate == 0) {
          pAVar8->sky = 1;
          pAVar8->temp = 1;
          pAVar8->wind = 0;
        }
        ppAVar3 = &pAVar8->next;
        pAVar8 = *ppAVar3;
      } while (*ppAVar3 != (AREA_DATA_conflict *)0x0);
      for (; area != (AREA_DATA_conflict *)0x0; area = area->next) {
        switch(area->sky) {
        case 0:
          local_1218 = 0x6e69;
          uStack_1216 = 0x7420;
          uStack_1214 = 0x6568;
          uStack_1212 = 0x20;
          uStack_1211 = 0x73;
          uStack_1210 = 0x6f626120796b;
          uStack_120a = 0x76;
          uStack_1209 = 0x65;
          builtin_strncpy(acStack_1230 + 8,"loud to ",8);
          uStack_1220 = 0x656573206562;
          uStack_121a = 0x6e;
          uStack_1219 = 0x20;
          local_1238._0_1_ = 'T';
          local_1238._1_1_ = 'h';
          local_1238._2_1_ = 'e';
          local_1238._3_1_ = 'r';
          local_1238._4_1_ = 'e';
          local_1238._5_1_ = ' ';
          local_1238._6_1_ = 'i';
          local_1238._7_1_ = 's';
          builtin_strncpy(acStack_1230," not a c",8);
          uStack_1208 = 0x2e;
          break;
        case 1:
          builtin_strncpy(acStack_1230 + 8," the ski",8);
          uStack_1220 = 0x6f6261207365;
          uStack_121a = 0x76;
          uStack_1219 = 0x65;
          local_1238._0_1_ = 'A';
          local_1238._1_1_ = ' ';
          local_1238._2_1_ = 'f';
          local_1238._3_1_ = 'e';
          local_1238._4_1_ = 'w';
          local_1238._5_1_ = ' ';
          local_1238._6_1_ = 'c';
          local_1238._7_1_ = 'l';
          builtin_strncpy(acStack_1230,"ouds dot",8);
          local_1218 = 0x2e;
          break;
        case 2:
          local_1218 = 0x7275;
          uStack_1216 = 0x7365;
          uStack_1214 = 0x7420;
          uStack_1212 = 0x68;
          uStack_1211 = 0x65;
          uStack_1210 = 0x2e796b7320;
          builtin_strncpy(acStack_1230 + 8,"s of clo",8);
          uStack_1220 = 0x626f20736475;
          uStack_121a = 0x73;
          uStack_1219 = 99;
          uVar13._0_1_ = 'A';
          uVar13._1_1_ = ' ';
          uVar13._2_1_ = 't';
          uVar13._3_1_ = 'h';
          uVar14._0_1_ = 'i';
          uVar14._1_1_ = 'c';
          uVar14._2_1_ = 'k';
          uVar14._3_1_ = ' ';
          uVar15._0_1_ = 'g';
          uVar15._1_1_ = 'r';
          uVar15._2_1_ = 'e';
          uVar15._3_1_ = 'y';
          uVar16._0_1_ = ' ';
          uVar16._1_1_ = 'm';
          uVar16._2_1_ = 'a';
          uVar16._3_1_ = 's';
          goto LAB_002c140f;
        case 3:
          builtin_strncpy(acStack_1230 + 8,"falls fr",8);
          uStack_1220 = 0x656874206d6f;
          uStack_121a = 0x20;
          uStack_1219 = 0x73;
          local_1238._0_1_ = 'A';
          local_1238._1_1_ = ' ';
          local_1238._2_1_ = 'l';
          local_1238._3_1_ = 'i';
          local_1238._4_1_ = 'g';
          local_1238._5_1_ = 'h';
          local_1238._6_1_ = 't';
          local_1238._7_1_ = ' ';
          builtin_strncpy(acStack_1230,"drizzle ",8);
          local_1218 = 0x796b;
          uStack_1216 = 0x2e;
          break;
        case 4:
          local_1218 = 0x2065;
          uStack_1216 = 0x6b73;
          uStack_1214 = 0x6569;
          uStack_1212 = 0x73;
          uStack_1211 = 0x20;
          uStack_1210 = 0x2e65766f6261;
          uStack_120a = 0;
          builtin_strncpy(acStack_1230 + 8,"our down",8);
          uStack_1220 = 0x206d6f726620;
          uStack_121a = 0x74;
          uStack_1219 = 0x68;
          uVar13._0_1_ = 'S';
          uVar13._1_1_ = 'h';
          uVar13._2_1_ = 'e';
          uVar13._3_1_ = 'e';
          uVar14._0_1_ = 't';
          uVar14._1_1_ = 's';
          uVar14._2_1_ = ' ';
          uVar14._3_1_ = 'o';
          uVar15._0_1_ = 'f';
          uVar15._1_1_ = ' ';
          uVar15._2_1_ = 'r';
          uVar15._3_1_ = 'a';
          uVar16._0_1_ = 'i';
          uVar16._1_1_ = 'n';
          uVar16._2_1_ = ' ';
          uVar16._3_1_ = 'p';
LAB_002c140f:
          local_1238 = CONCAT44(uVar14,uVar13);
          acStack_1230[4] = (char)uVar16;
          acStack_1230[5] = SUB41(uVar16,1);
          acStack_1230[6] = SUB41(uVar16,2);
          acStack_1230[7] = SUB41(uVar16,3);
          acStack_1230[0] = (char)uVar15;
          acStack_1230[1] = SUB41(uVar15,1);
          acStack_1230[2] = SUB41(uVar15,2);
          acStack_1230[3] = SUB41(uVar15,3);
          break;
        case 5:
          __n = 0x4b;
          __src = "Lightning flashes in the distance as a booming peal of thunder approaches.";
          goto LAB_002c1478;
        case 6:
          local_1218 = 0x7266;
          uStack_1216 = 0x6d6f;
          uStack_1214 = 0x7420;
          uStack_1212 = 0x68;
          uStack_1211 = 0x65;
          uStack_1210 = 0x7365696b7320;
          builtin_strncpy(acStack_1230 + 8,"akes dri",8);
          uStack_1220 = 0x776f64207466;
          uStack_121a = 0x6e;
          uStack_1219 = 0x20;
          local_1238._0_1_ = 'S';
          local_1238._1_1_ = 'c';
          local_1238._2_1_ = 'a';
          local_1238._3_1_ = 't';
          local_1238._4_1_ = 't';
          local_1238._5_1_ = 'e';
          local_1238._6_1_ = 'r';
          local_1238._7_1_ = 'e';
          builtin_strncpy(acStack_1230,"d snowfl",8);
          uStack_120a = 0x20;
          uStack_1209 = 0x61;
          uStack_1208 = 0x6f62;
          uStack_1206 = 0x2e6576;
          break;
        case 7:
          __n = 0x42;
          __src = "Driving snow sweeps down from the skies as a chill fills the air.";
LAB_002c1478:
          memcpy(&local_1238,__src,__n);
          break;
        case 8:
          local_1218 = 0x6620;
          uStack_1216 = 0x6c61;
          uStack_1214 = 0x206c;
          uStack_1212 = 0x66;
          uStack_1211 = 0x72;
          uStack_1210 = 0x656874206d6f;
          builtin_strncpy(acStack_1230 + 8,"lstones ",8);
          uStack_1220 = 0x206e69676562;
          uStack_121a = 0x74;
          uStack_1219 = 0x6f;
          local_1238._0_1_ = 'P';
          local_1238._1_1_ = 'e';
          local_1238._2_1_ = 'b';
          local_1238._3_1_ = 'b';
          local_1238._4_1_ = 'l';
          local_1238._5_1_ = 'e';
          local_1238._6_1_ = '-';
          local_1238._7_1_ = 's';
          builtin_strncpy(acStack_1230,"ized hai",8);
          uStack_120a = 0x20;
          uStack_1209 = 0x73;
          uStack_1208 = 0x696b;
          uStack_1206 = 0x2e7365;
          break;
        default:
          local_1238 = local_1238 & 0xffffffffffffff00;
        }
        outdoors_echo(area,(char *)&local_1238);
      }
    }
  }
  return;
}

Assistant:

void weather_update(void)
{
	char buf[MSL];
	int i, random, season = time_info.season;
	int average = 0, skytot = 0, temptot = 0;
	AREA_DATA *area;

	/* Randomize sky, temperature, wind for each area, based on climate */
	for (area = area_first; area; area = area->next)
	{
		random = number_percent();

		for (i = 0; i < WeatherCondition::MaxWeatherCondition; i++)
		{
			if (random <= climate_table[area->climate].skyfreqs[season][i])
			{
				area->sky = i;
				break;
			}
		}

		random = number_percent();

		for (i = 0; i < Temperature::MaxTemperature; i++)
		{
			if (random <= climate_table[area->climate].tempfreqs[season][i])
			{
				area->temp = i;
				break;
			}
		}

		area->wind = number_range(0, 2);
	}

	/* Adjacent areas have a moderating influence on weather.  If there's
	 * a blizzard going on next door, it won't be perfectly sunny.  Similarly,
	 * it won't be hot and snowing at the same time, etc.  Just make sure that
	 * illogical combinations are eliminated. */
	for (area = area_first; area; area = area->next)
	{
		skytot = 0;
		temptot = 0;

		for (i = 0; i < MAX_ADJACENT; i++)
		{
			if (!area->adjacent[i])
				break;

			skytot += area->adjacent[i]->sky;
			temptot += area->adjacent[i]->temp;
		}

		if (i > 0)
		{
			average = skytot / (i + 1);

			if (abs(average - area->sky) >= 4)
				area->sky = (area->sky + average) / 2;

			average = temptot / (i + 1);

			if (abs(average - area->temp) >= 2)
				area->temp = (area->sky + average) / 2;
		}

		if (area->sky >= WeatherCondition::SnowFlurry && area->temp < Temperature::Cool)
			area->temp = Temperature::Cool;

		if (area->sky == WeatherCondition::Downpour
				 || area->sky == WeatherCondition::ThunderStorm
				 || area->sky == WeatherCondition::Blizzard)
			area->wind++;

		if (area->climate == Climate::None)
		{
			area->sky = WeatherCondition::PartlyCloudy;
			area->temp = Temperature::Warm;
			area->wind = Windspeed::Calm;
		}
	}

	/* Echo the changing weather to everyone who's outdoors. */
	for (area = area_first; area; area = area->next)
	{
		switch (area->sky)
		{
			case WeatherCondition::Clear:
				sprintf(buf, "There is not a cloud to be seen in the sky above.");
				break;
			case WeatherCondition::PartlyCloudy:
				sprintf(buf, "A few clouds dot the skies above.");
				break;
			case WeatherCondition::Overcast:
				sprintf(buf, "A thick grey mass of clouds obscures the sky.");
				break;
			case WeatherCondition::Drizzle:
				sprintf(buf, "A light drizzle falls from the sky.");
				break;
			case WeatherCondition::Downpour:
				sprintf(buf, "Sheets of rain pour down from the skies above.");
				break;
			case WeatherCondition::ThunderStorm:
				sprintf(buf, "Lightning flashes in the distance as a booming peal of thunder approaches.");
				break;
			case WeatherCondition::SnowFlurry:
				sprintf(buf, "Scattered snowflakes drift down from the skies above.");
				break;
			case WeatherCondition::Blizzard:
				sprintf(buf, "Driving snow sweeps down from the skies as a chill fills the air.");
				break;
			case WeatherCondition::Hail:
				sprintf(buf, "Pebble-sized hailstones begin to fall from the skies.");
				break;
			default:
				buf[0] = '\0';
				break;
		}

		outdoors_echo(area, buf);
	}
}